

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_fusion.cpp
# Opt level: O2

bool __thiscall spvtools::opt::LoopFusion::CheckInit(LoopFusion *this)

{
  bool bVar1;
  int64_t loop_0_init;
  int64_t loop_1_init;
  long local_18;
  long local_10;
  
  bVar1 = Loop::GetInductionInitValue(this->loop_0_,this->induction_0_,&local_18);
  if (bVar1) {
    bVar1 = Loop::GetInductionInitValue(this->loop_1_,this->induction_1_,&local_10);
    bVar1 = local_18 == local_10 && bVar1;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool LoopFusion::CheckInit() {
  int64_t loop_0_init;
  if (!loop_0_->GetInductionInitValue(induction_0_, &loop_0_init)) {
    return false;
  }

  int64_t loop_1_init;
  if (!loop_1_->GetInductionInitValue(induction_1_, &loop_1_init)) {
    return false;
  }

  if (loop_0_init != loop_1_init) {
    return false;
  }

  return true;
}